

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8 * google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItemsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int iVar2;
  UnknownField *this;
  uint8 *puVar3;
  int i;
  int index;
  
  index = 0;
  while( true ) {
    pvVar1 = unknown_fields->fields_;
    iVar2 = 0;
    if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      iVar2 = (int)((ulong)((long)(pvVar1->
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar1->
                                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (iVar2 <= index) break;
    this = UnknownFieldSet::field(unknown_fields,index);
    if (this->type_ == 3) {
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0xb,target);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0x10,puVar3);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(this->number_,puVar3);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0x1a,puVar3);
      puVar3 = UnknownField::SerializeLengthDelimitedNoTagToArray(this,puVar3);
      target = io::CodedOutputStream::WriteVarint32ToArray(0xc,puVar3);
    }
    index = index + 1;
  }
  return target;
}

Assistant:

uint8* WireFormat::SerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields,
    uint8* target) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target = io::CodedOutputStream::WriteVarint32ToArray(
          field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);
      target = field.SerializeLengthDelimitedNoTagToArray(target);

      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}